

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O3

void __thiscall
t_dart_generator::generate_dart_struct(t_dart_generator *this,t_struct *tstruct,bool is_exception)

{
  pointer pcVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  ostream *poVar4;
  _func_int **pp_Var5;
  long *plVar6;
  t_dart_generator *this_00;
  string imports;
  string f_struct_name;
  string file_name;
  ofstream_with_content_based_conditional_update f_struct;
  char *local_2b0;
  long local_2a8;
  char local_2a0 [16];
  string local_290;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  undefined1 local_1d0 [16];
  _func_int *local_1c0;
  long lStack_1b8;
  string local_160 [32];
  undefined1 local_140;
  ios_base local_138 [264];
  
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  this_00 = *(t_dart_generator **)CONCAT44(extraout_var,iVar2);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,this_00,
             (long)&(this_00->super_t_oop_generator).super_t_generator._vptr_t_generator +
             ((long *)CONCAT44(extraout_var,iVar2))[1]);
  get_file_name(&local_250,this_00,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  pcVar1 = (this->src_dir_)._M_dataplus._M_p;
  local_2b0 = local_2a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b0,pcVar1,pcVar1 + (this->src_dir_)._M_string_length);
  std::__cxx11::string::append((char *)&local_2b0);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_2b0,(ulong)local_250._M_dataplus._M_p);
  pp_Var5 = (_func_int **)(plVar3 + 2);
  if ((_func_int **)*plVar3 == pp_Var5) {
    local_1c0 = *pp_Var5;
    lStack_1b8 = plVar3[3];
    local_1d0._0_8_ = &local_1c0;
  }
  else {
    local_1c0 = *pp_Var5;
    local_1d0._0_8_ = (_func_int **)*plVar3;
  }
  local_1d0._8_8_ = plVar3[1];
  *plVar3 = (long)pp_Var5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append(local_1d0);
  local_270 = &local_260;
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_260 = *plVar6;
    lStack_258 = plVar3[3];
  }
  else {
    local_260 = *plVar6;
    local_270 = (long *)*plVar3;
  }
  local_268 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((_func_int **)local_1d0._0_8_ != &local_1c0) {
    operator_delete((void *)local_1d0._0_8_);
  }
  if (local_2b0 != local_2a0) {
    operator_delete(local_2b0);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0);
  std::__cxx11::string::string((string *)&local_2b0,(char *)local_270,(allocator *)&local_290);
  std::__cxx11::string::_M_assign(local_160);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0);
  local_140 = 0;
  if (local_2b0 != local_2a0) {
    operator_delete(local_2b0);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_2b0,this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,local_2b0,local_2a8);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_210,local_250._M_dataplus._M_p,
             local_250._M_dataplus._M_p + local_250._M_string_length);
  dart_library(&local_290,this,&local_210);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_290._M_dataplus._M_p,local_290._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  if (local_2b0 != local_2a0) {
    operator_delete(local_2b0);
  }
  local_2a8 = 0;
  local_2a0[0] = '\0';
  local_2b0 = local_2a0;
  dart_thrift_imports_abi_cxx11_(&local_290,this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,local_290._M_dataplus._M_p,local_290._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,local_250._M_dataplus._M_p,
             local_250._M_dataplus._M_p + local_250._M_string_length);
  poVar4 = (ostream *)local_1d0;
  generate_dart_struct_definition(this,poVar4,tstruct,is_exception,false,&local_230);
  iVar2 = (int)poVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0,iVar2);
  if (local_2b0 != local_2a0) {
    operator_delete(local_2b0);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base(local_138);
  if (local_270 != &local_260) {
    operator_delete(local_270);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_dart_generator::generate_dart_struct(t_struct* tstruct, bool is_exception) {
  string file_name = get_file_name(tstruct->get_name());
  string f_struct_name = src_dir_ + "/" + file_name + ".dart";
  ofstream_with_content_based_conditional_update f_struct;
  f_struct.open(f_struct_name.c_str());

  f_struct << autogen_comment() << dart_library(file_name) << endl;

  string imports;

  f_struct << dart_thrift_imports() << endl;

  generate_dart_struct_definition(f_struct, tstruct, is_exception, false, file_name);

  f_struct.close();
}